

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O1

char __thiscall ConnectFourState::get_winner(ConnectFourState *this)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  pointer pvVar12;
  pointer pvVar13;
  char *pcVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  
  uVar3 = this->last_col;
  uVar7 = (ulong)uVar3;
  if ((int)uVar3 < 0) {
    return '.';
  }
  uVar4 = this->last_row;
  uVar8 = (ulong)uVar4;
  pvVar13 = (this->board).
            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar16 = *(long *)&pvVar13[(int)uVar4].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data;
  cVar2 = *(char *)(lVar16 + uVar7);
  if (uVar7 == 0) {
    iVar10 = 1;
  }
  else {
    uVar17 = 1;
    if (1 < (int)uVar3) {
      uVar17 = uVar3;
    }
    pcVar14 = (char *)(uVar7 + lVar16);
    uVar9 = 0;
    do {
      pcVar14 = pcVar14 + -1;
      if (*pcVar14 != cVar2) break;
      uVar9 = uVar9 + 1;
    } while (uVar17 != uVar9);
    iVar10 = uVar9 + 1;
  }
  iVar5 = this->num_cols;
  lVar1 = uVar7 + 1;
  iVar18 = 0;
  if ((int)lVar1 < iVar5) {
    iVar18 = ~uVar3 + iVar5;
    lVar21 = 0;
    do {
      if (*(char *)(lVar16 + lVar1 + lVar21) != cVar2) {
        iVar18 = (int)lVar21;
        break;
      }
      lVar21 = lVar21 + 1;
    } while (iVar18 != (int)lVar21);
  }
  cVar6 = cVar2;
  if ((uint)(iVar10 + iVar18) < 4) {
    if ((int)uVar4 < 1) {
      iVar10 = 1;
    }
    else {
      pvVar12 = pvVar13 + uVar8;
      uVar17 = 0;
      do {
        pvVar12 = pvVar12 + -1;
        uVar9 = uVar17;
        if (*(char *)(*(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data + uVar7) != cVar2) break;
        uVar17 = uVar17 + 1;
        uVar9 = uVar4;
      } while (uVar4 != uVar17);
      iVar10 = uVar9 + 1;
    }
    iVar18 = this->num_rows;
    lVar16 = (long)(int)uVar4 + 1;
    iVar15 = (int)lVar16;
    iVar20 = 0;
    if (iVar15 < iVar18) {
      pvVar12 = pvVar13 + lVar16;
      iVar11 = 0;
      do {
        iVar20 = iVar11;
        if (*(char *)(*(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data + uVar7) != cVar2) break;
        iVar11 = iVar11 + 1;
        pvVar12 = pvVar12 + 1;
        iVar20 = ~uVar4 + iVar18;
      } while (~uVar4 + iVar18 != iVar11);
    }
    if ((uint)(iVar10 + iVar20) < 4) {
      iVar10 = 1;
      if (uVar7 != 0 && 0 < (int)uVar4) {
        pvVar12 = pvVar13 + uVar8;
        iVar10 = 0;
        uVar19 = uVar8;
        uVar22 = uVar7;
        do {
          pvVar12 = pvVar12 + -1;
          if ((*(char *)(*(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>).
                                   _M_impl.super__Vector_impl_data + -1 + uVar22) != cVar2) ||
             (iVar10 = iVar10 + 1, (long)uVar19 < 2)) break;
          uVar19 = uVar19 - 1;
          iVar20 = (int)uVar22;
          uVar22 = uVar22 - 1;
        } while (1 < iVar20);
        iVar10 = iVar10 + 1;
      }
      iVar20 = 0;
      if (((int)(uVar4 + 1) < iVar18) && ((int)(uVar3 + 1) < iVar5)) {
        pvVar12 = pvVar13 + iVar15;
        uVar19 = 0;
        while (iVar20 = (int)uVar19,
              *(char *)(uVar19 + *(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>
                                           )._M_impl.super__Vector_impl_data + lVar1) == cVar2) {
          lVar16 = (long)iVar15 + 1 + uVar19;
          uVar19 = uVar19 + 1;
          if ((iVar18 <= lVar16) || (pvVar12 = pvVar12 + 1, iVar5 <= (int)(iVar20 + uVar3 + 2)))
          goto LAB_0010c0fc;
        }
        uVar19 = uVar19 & 0xffffffff;
LAB_0010c0fc:
        iVar20 = (int)uVar19;
      }
      if ((uint)(iVar10 + iVar20) < 4) {
        iVar10 = 1;
        if (uVar7 != 0 && (int)(uVar4 + 1) < iVar18) {
          pvVar12 = pvVar13 + iVar15;
          lVar16 = 0;
          do {
            if ((*(char *)(*(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>).
                                     _M_impl.super__Vector_impl_data + -1 + uVar7) != cVar2) ||
               (lVar21 = (long)iVar15 + 1 + lVar16, lVar16 = lVar16 + 1, iVar18 <= lVar21)) break;
            pvVar12 = pvVar12 + 1;
            iVar10 = (int)uVar7;
            uVar7 = uVar7 - 1;
          } while (1 < iVar10);
          iVar10 = (int)lVar16 + 1;
        }
        uVar7 = 0;
        if ((0 < (int)uVar4) && ((int)(uVar3 + 1) < iVar5)) {
          pvVar13 = pvVar13 + uVar8;
          uVar7 = 0;
          while( true ) {
            pvVar13 = pvVar13 + -1;
            iVar18 = (int)uVar7;
            if (*(char *)(uVar7 + *(long *)&(pvVar13->
                                            super__Vector_base<char,_std::allocator<char>_>)._M_impl
                                            .super__Vector_impl_data + lVar1) != cVar2) break;
            uVar7 = uVar7 + 1;
            if (((long)uVar8 < 2) || (uVar8 = uVar8 - 1, iVar5 <= (int)(iVar18 + uVar3 + 2)))
            goto LAB_0010c1b0;
          }
          uVar7 = uVar7 & 0xffffffff;
        }
LAB_0010c1b0:
        cVar6 = '.';
        if (3 < (uint)(iVar10 + (int)uVar7)) {
          cVar6 = cVar2;
        }
      }
    }
  }
  return cVar6;
}

Assistant:

char get_winner() const
	{
		if (last_col < 0) {
			return player_markers[0];
		}

		// We only need to check around the last piece played.
		auto piece = board[last_row][last_col];

		// X X X X
		int left = 0, right = 0;
		for (int col = last_col - 1; col >= 0 && board[last_row][col] == piece; --col) left++;
		for (int col = last_col + 1; col < num_cols && board[last_row][col] == piece; ++col) right++;
		if (left + 1 + right >= 4) {
			return piece;
		}

		// X
		// X
		// X
		// X
		int up = 0, down = 0;
		for (int row = last_row - 1; row >= 0 && board[row][last_col] == piece; --row) up++;
		for (int row = last_row + 1; row < num_rows && board[row][last_col] == piece; ++row) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		// X
		//  X
		//   X
		//    X
		up = 0;
		down = 0;
		for (int row = last_row - 1, col = last_col - 1; row >= 0 && col >= 0 && board[row][col] == piece; --row, --col) up++;
		for (int row = last_row + 1, col = last_col + 1; row < num_rows && col < num_cols && board[row][col] == piece; ++row, ++col) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		//    X
		//   X
		//  X
		// X
		up = 0;
		down = 0;
		for (int row = last_row + 1, col = last_col - 1; row < num_rows && col >= 0 && board[row][col] == piece; ++row, --col) up++;
		for (int row = last_row - 1, col = last_col + 1; row >= 0 && col < num_cols && board[row][col] == piece; --row, ++col) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		return player_markers[0];
	}